

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

void cft_fasttext_get_word_vector(fasttext_t *handle,char *word,float *buf)

{
  int iVar1;
  Vector vec;
  allocator local_51;
  _Vector_base<float,_std::allocator<float>_> local_50;
  string local_38;
  
  iVar1 = fasttext::FastText::getDimension((FastText *)handle);
  fasttext::Vector::Vector((Vector *)&local_50,(long)iVar1);
  std::__cxx11::string::string((string *)&local_38,word,&local_51);
  fasttext::FastText::getWordVector((FastText *)handle,(Vector *)&local_50,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  memcpy(buf,local_50._M_impl.super__Vector_impl_data._M_start,
         (long)local_50._M_impl.super__Vector_impl_data._M_finish -
         (long)local_50._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void cft_fasttext_get_word_vector(fasttext_t* handle, const char* word, float* buf) {
    Vector vec(((FastText*)handle)->getDimension());
    ((FastText*)handle)->getWordVector(vec, word);
    memcpy(buf, vec.data(), vec.size() * sizeof(real));
}